

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O0

bool __thiscall
EthUdpPort::PacketSend
          (EthUdpPort *this,nodeid_t node,uchar *packet,size_t nbytes,bool useEthernetBroadcast)

{
  int iVar1;
  unsigned_long uVar2;
  ostream *poVar3;
  void *this_00;
  bool bVar4;
  int nSent;
  unsigned_long fver;
  EthDestType destType;
  uchar ip_offset;
  bool useEthernetBroadcast_local;
  size_t nbytes_local;
  uchar *packet_local;
  nodeid_t node_local;
  EthUdpPort *this_local;
  
  fver._6_1_ = '\0';
  if (useEthernetBroadcast) {
    uVar2 = BasePort::GetFirmwareVersion
                      ((BasePort *)this,(this->super_EthBasePort).super_BasePort.HubBoard);
    fver._0_4_ = DEST_MULTICAST;
    if (uVar2 < 9) {
      fver._0_4_ = DEST_BROADCAST;
    }
  }
  else {
    fver._0_4_ = DEST_UNICAST;
    if (((this->super_EthBasePort).useFwBridge & 1U) == 0) {
      if (node < 0x10) {
        fver._6_1_ = (uchar)node;
      }
      else {
        fver._0_4_ = (EthDestType)(node == 0x3f);
      }
    }
    else {
      uVar2 = BasePort::GetFirmwareVersion
                        ((BasePort *)this,(this->super_EthBasePort).super_BasePort.HubBoard);
      if (8 < uVar2) {
        fver._6_1_ = (this->super_EthBasePort).super_BasePort.HubBoard;
      }
    }
  }
  iVar1 = SocketInternals::Send(this->sockPtr,packet,nbytes,(EthDestType)fver,fver._6_1_);
  bVar4 = iVar1 == (int)nbytes;
  if (!bVar4) {
    poVar3 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                             "PacketSend: failed to send via UDP: return value = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,", expected = ");
    this_00 = (void *)std::ostream::operator<<(poVar3,nbytes);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return bVar4;
}

Assistant:

bool EthUdpPort::PacketSend(nodeid_t node, unsigned char *packet, size_t nbytes, bool useEthernetBroadcast)
{
    unsigned char ip_offset = 0;
    SocketInternals::EthDestType destType;
    if (useEthernetBroadcast) {
        // Checking the firmware version of HubBoard covers two cases:
        //   1) Supports firmware prior to Rev 9, which does not respond to UDP multicast.
        //   2) Ensures that BROADCAST is used for the first few packets (i.e., before this
        //      class reads the Firmware version), which is necessary for proper operation.
        unsigned long fver = GetFirmwareVersion(HubBoard);
        destType = (fver < 9) ? SocketInternals::DEST_BROADCAST
                              : SocketInternals::DEST_MULTICAST;
    }
    else {
        destType = SocketInternals::DEST_UNICAST;
        if (useFwBridge) {
            // If using the Ethernet/Firewire bridge, then we only need to talk to the Hub board,
            // which has ip_offset=0 for firmware prior to Rev 9
            if (GetFirmwareVersion(HubBoard) >= 9)
                ip_offset = HubBoard;
        }
        else {
            // If not using Ethernet/Firewire bridge, then node id is equal to board id;
            // Don't need to check firmware version because if we got here, it must be at
            // least Rev 9.
            if (node < BoardIO::MAX_BOARDS)
                ip_offset = static_cast<unsigned char>(node);
            else if (node == FW_NODE_BROADCAST)
                destType = SocketInternals::DEST_MULTICAST;
        }
    }

    int nSent = sockPtr->Send(packet, nbytes, destType, ip_offset);

    if (nSent != static_cast<int>(nbytes)) {
        outStr << "PacketSend: failed to send via UDP: return value = " << nSent
               << ", expected = " << nbytes << std::endl;
        return false;
    }
    return true;
}